

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O2

void Eso_ManMinimizeAdd(Eso_Man_t *p,int Cube)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  Hsh_VecObj_t *pHVar6;
  ulong uVar7;
  int *pCube2;
  int iVar8;
  ulong uVar9;
  Hsh_VecMan_t *p_00;
  ulong uVar10;
  
LAB_0059408b:
  while( true ) {
    if ((p->Cube1 == Cube) || (pVVar4 = Eso_ManCube(p,Cube), p->Cube1 == Cube)) {
      pCube2 = (int *)0x0;
      uVar10 = 0;
    }
    else {
      pCube2 = pVVar4->pArray;
      uVar10 = (ulong)(uint)pVVar4->nSize;
    }
    iVar3 = (int)uVar10;
    pVVar4 = Vec_WecEntry(p->vCubes,iVar3);
    uVar2 = pVVar4->nSize;
    uVar7 = 0;
    if (0 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      if (pVVar4->pArray[uVar9] == Cube) {
        Vec_IntDrop(pVVar4,(int)uVar9);
        return;
      }
    }
    if (p->Cube1 == Cube) break;
    if (iVar3 < p->nVars + -1) {
      pVVar5 = Vec_WecEntry(p->vCubes,iVar3 + 1);
      iVar8 = 0;
LAB_0059411f:
      if (iVar8 < pVVar5->nSize) {
        iVar1 = Vec_IntEntry(pVVar5,iVar8);
        pHVar6 = Hsh_VecObj(p->pHash,iVar1);
        uVar2 = Eso_ManFindDistOneLitNotEqual(pCube2,&pHVar6[1].nSize,iVar3);
        if (uVar2 == 0xffffffff) goto code_r0x0059415c;
        Vec_IntDrop(pVVar5,iVar8);
        p->vCube->nSize = 0;
        for (uVar10 = 0; (long)uVar10 <= (long)iVar3; uVar10 = uVar10 + 1) {
          pVVar4 = p->vCube;
          iVar8 = Abc_LitNotCond((&pHVar6[1].nSize)[uVar10],(uint)(uVar2 == uVar10));
          Vec_IntPush(pVVar4,iVar8);
        }
        p_00 = p->pHash;
        pVVar4 = p->vCube;
        goto LAB_00594325;
      }
    }
    iVar8 = 0;
LAB_0059416f:
    if (pVVar4->nSize <= iVar8) goto LAB_005941a3;
    iVar1 = Vec_IntEntry(pVVar4,iVar8);
    pHVar6 = Hsh_VecObj(p->pHash,iVar1);
    uVar2 = Eso_ManFindDistOneLitEqual(&pHVar6[1].nSize,pCube2,iVar3);
    if (uVar2 == 0xffffffff) goto code_r0x0059419f;
    Vec_IntDrop(pVVar4,iVar8);
    p->vCube->nSize = 0;
    if (iVar3 < 1) {
      uVar10 = 0;
    }
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      if (uVar2 != uVar7) {
        Vec_IntPush(p->vCube,pCube2[uVar7]);
      }
    }
    pVVar4 = p->vCube;
    if (pVVar4->nSize != 0) {
      p_00 = p->pHash;
      goto LAB_00594325;
    }
    Cube = p->Cube1;
  }
  if (uVar2 != 0) {
    __assert_fail("Vec_IntSize(vLevel) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEsop.c"
                  ,0x10b,"void Eso_ManMinimizeAdd(Eso_Man_t *, int)");
  }
LAB_00594354:
  Vec_IntPush(pVVar4,Cube);
  return;
code_r0x0059415c:
  iVar8 = iVar8 + 1;
  goto LAB_0059411f;
LAB_005941a3:
  if (iVar3 < 1) {
    __assert_fail("nLits > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEsop.c"
                  ,0x13e,"void Eso_ManMinimizeAdd(Eso_Man_t *, int)");
  }
  pVVar5 = Vec_WecEntry(p->vCubes,iVar3 + -1);
  if ((iVar3 == 1) && (pVVar5->nSize == 1)) {
    Vec_IntDrop(pVVar5,0);
    Cube = Abc_LitNot(Cube);
    goto LAB_00594354;
  }
  iVar8 = 0;
  while( true ) {
    if (pVVar5->nSize <= iVar8) goto LAB_00594354;
    iVar1 = Vec_IntEntry(pVVar5,iVar8);
    pHVar6 = Hsh_VecObj(p->pHash,iVar1);
    uVar2 = Eso_ManFindDistOneLitNotEqual(&pHVar6[1].nSize,pCube2,iVar3 + -1);
    if (uVar2 != 0xffffffff) break;
    iVar8 = iVar8 + 1;
  }
  Vec_IntDrop(pVVar5,iVar8);
  p->vCube->nSize = 0;
  for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    pVVar4 = p->vCube;
    iVar3 = Abc_LitNotCond(pCube2[uVar7],(uint)(uVar2 == uVar7));
    Vec_IntPush(pVVar4,iVar3);
  }
  p_00 = p->pHash;
  pVVar4 = p->vCube;
LAB_00594325:
  Cube = Hsh_VecManAdd(p_00,pVVar4);
  goto LAB_0059408b;
code_r0x0059419f:
  iVar8 = iVar8 + 1;
  goto LAB_0059416f;
}

Assistant:

void Eso_ManMinimizeAdd( Eso_Man_t * p, int Cube )
{
    int fMimimize = 1;
    Vec_Int_t * vCube      = (Cube == p->Cube1) ? NULL : Eso_ManCube(p, Cube); 
    int * pCube2, * pCube  = (Cube == p->Cube1) ? NULL : Vec_IntArray(vCube); 
    int Cube2, nLits       = (Cube == p->Cube1) ? 0 : Vec_IntSize(vCube);
    Vec_Int_t * vLevel     = Vec_WecEntry( p->vCubes, nLits );
    int c, k, iLit, iPlace = Vec_IntFind( vLevel, Cube );
    if ( iPlace >= 0 ) // identical found
    {
        Vec_IntDrop( vLevel, iPlace );
        return;
    }
    if ( Cube == p->Cube1 ) // simple case
    {
        assert( Vec_IntSize(vLevel) == 0 );
        Vec_IntPush( vLevel, Cube );
        return;
    }
    // look for distance-1 in next bin
    if ( fMimimize && nLits < p->nVars - 1 )
    {
        Vec_Int_t * vLevel = Vec_WecEntry( p->vCubes, nLits+1 );
        Vec_IntForEachEntry( vLevel, Cube2, c )
        {
            pCube2 = Hsh_VecReadArray( p->pHash, Cube2 ); 
            iLit = Eso_ManFindDistOneLitNotEqual( pCube, pCube2, nLits );
            if ( iLit == -1 )
                continue;
            // remove this cube
            Vec_IntDrop( vLevel, c );
            // create new cube
            Vec_IntClear( p->vCube );
            for ( k = 0; k <= nLits; k++ )
                Vec_IntPush( p->vCube, Abc_LitNotCond(pCube2[k], k == iLit) );
            Cube = Hsh_VecManAdd( p->pHash, p->vCube );
            // try to add new cube
            Eso_ManMinimizeAdd( p, Cube );
            return;
        }
    }
    // look for distance-1 in the same bin
    if ( fMimimize )
    {
        Vec_IntForEachEntry( vLevel, Cube2, c )
        {
            pCube2 = Hsh_VecReadArray( p->pHash, Cube2 ); 
            iLit = Eso_ManFindDistOneLitEqual( pCube2, pCube, nLits );
            if ( iLit == -1 )
                continue;
            // remove this cube
            Vec_IntDrop( vLevel, c );
            // create new cube
            Vec_IntClear( p->vCube );
            for ( k = 0; k < nLits; k++ )
                if ( k != iLit )
                    Vec_IntPush( p->vCube, pCube[k] );
            if ( Vec_IntSize(p->vCube) == 0 )
                Cube = p->Cube1;
            else
                Cube = Hsh_VecManAdd( p->pHash, p->vCube );
            // try to add new cube
            Eso_ManMinimizeAdd( p, Cube );
            return;
        }
    }
    assert( nLits > 0 );
    if ( fMimimize && nLits > 0 )
    {
        // look for distance-1 in the previous bin
        Vec_Int_t * vLevel = Vec_WecEntry( p->vCubes, nLits-1 );
        // check for the case of one-literal cube
        if ( nLits == 1 && Vec_IntSize(vLevel) == 1 )
        {
            Vec_IntDrop( vLevel, 0 );
            Cube = Abc_LitNot( Cube );
        }
        else
        Vec_IntForEachEntry( vLevel, Cube2, c )
        {
            pCube2 = Hsh_VecReadArray( p->pHash, Cube2 ); 
            iLit = Eso_ManFindDistOneLitNotEqual( pCube2, pCube, nLits-1 );
            if ( iLit == -1 )
                continue;
            // remove this cube
            Vec_IntDrop( vLevel, c );
            // create new cube
            Vec_IntClear( p->vCube );
            for ( k = 0; k < nLits; k++ )
                Vec_IntPush( p->vCube, Abc_LitNotCond(pCube[k], k == iLit) );
            Cube = Hsh_VecManAdd( p->pHash, p->vCube );
            // try to add new cube
            Eso_ManMinimizeAdd( p, Cube );
            return;
        }
    }
    // could not find - simply add this cube
    Vec_IntPush( vLevel, Cube );
}